

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O2

void Ptex::v2_2::PtexUtils::reducev
               (void *src,int sstride,int uw,int vw,void *dst,int dstride,DataType dt,int nchan)

{
  uint16_t uVar1;
  void *pvVar2;
  void *pvVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  switch(dt) {
  case dt_uint8:
    iVar4 = nchan * uw;
    pvVar2 = (void *)((long)(vw * sstride) + (long)src);
    lVar5 = (long)sstride + (long)src;
    for (; src != pvVar2; src = (void *)((long)src + (long)(sstride * 2 - iVar4) + (long)iVar4)) {
      for (lVar6 = 0; iVar4 != lVar6; lVar6 = lVar6 + 1) {
        *(char *)((long)dst + lVar6) =
             (char)((uint)*(byte *)(lVar5 + lVar6) + (uint)*(byte *)((long)src + lVar6) >> 1);
      }
      dst = (void *)((long)dst + lVar6 + (dstride - iVar4));
      lVar5 = lVar5 + sstride * 2;
    }
    break;
  case dt_uint16:
    iVar4 = sstride / 2;
    pvVar2 = (void *)((long)src + (long)(vw * iVar4) * 2);
    pvVar3 = (void *)((long)src + (long)iVar4 * 2);
    lVar5 = (long)(iVar4 * 2) * 2;
    for (; src != pvVar2; src = (void *)((long)src + lVar5)) {
      for (lVar6 = 0; (long)(nchan * uw) * 2 != lVar6; lVar6 = lVar6 + 2) {
        *(short *)((long)dst + lVar6) =
             (short)((uint)*(ushort *)((long)pvVar3 + lVar6) + (uint)*(ushort *)((long)src + lVar6)
                    >> 1);
      }
      dst = (void *)((long)dst + lVar6 + (long)(dstride / 2) * 2 + (long)(nchan * uw) * -2);
      pvVar3 = (void *)((long)pvVar3 + lVar5);
    }
    break;
  case dt_half:
    iVar4 = sstride / 2;
    pvVar2 = (void *)((long)src + (long)(vw * iVar4) * 2);
    pvVar3 = (void *)((long)src + (long)iVar4 * 2);
    lVar5 = (long)(iVar4 * 2) * 2;
    for (; src != pvVar2; src = (void *)((long)src + lVar5)) {
      for (lVar6 = 0; (long)(nchan * uw) * 2 != lVar6; lVar6 = lVar6 + 2) {
        uVar1 = PtexHalf::fromFloat((*(float *)(PtexHalf::h2fTable +
                                               (ulong)*(ushort *)((long)src + lVar6) * 4) +
                                    *(float *)(PtexHalf::h2fTable +
                                              (ulong)*(ushort *)((long)pvVar3 + lVar6) * 4)) * 0.5);
        *(uint16_t *)((long)dst + lVar6) = uVar1;
      }
      dst = (void *)((long)dst + lVar6 + (long)(dstride / 2) * 2 + (long)(nchan * uw) * -2);
      pvVar3 = (void *)((long)pvVar3 + lVar5);
    }
    break;
  case dt_float:
    iVar4 = sstride / 4;
    pvVar2 = (void *)((long)src + (long)(vw * iVar4) * 4);
    pvVar3 = (void *)((long)src + (long)iVar4 * 4);
    lVar5 = (long)(iVar4 * 2) * 4;
    for (; src != pvVar2; src = (void *)((long)src + lVar5)) {
      for (lVar6 = 0; (long)(nchan * uw) * 4 != lVar6; lVar6 = lVar6 + 4) {
        *(float *)((long)dst + lVar6) =
             (*(float *)((long)src + lVar6) + *(float *)((long)pvVar3 + lVar6)) * 0.5;
      }
      dst = (void *)((long)dst + lVar6 + (long)(dstride / 4) * 4 + (long)(nchan * uw) * -4);
      pvVar3 = (void *)((long)pvVar3 + lVar5);
    }
  }
  return;
}

Assistant:

void reducev(const void* src, int sstride, int uw, int vw,
             void* dst, int dstride, DataType dt, int nchan)
{
    switch (dt) {
    case dt_uint8:     reducev(static_cast<const uint8_t*>(src), sstride, uw, vw,
                               static_cast<uint8_t*>(dst), dstride, nchan); break;
    case dt_half:      reducev(static_cast<const PtexHalf*>(src), sstride, uw, vw,
                               static_cast<PtexHalf*>(dst), dstride, nchan); break;
    case dt_uint16:    reducev(static_cast<const uint16_t*>(src), sstride, uw, vw,
                               static_cast<uint16_t*>(dst), dstride, nchan); break;
    case dt_float:     reducev(static_cast<const float*>(src), sstride, uw, vw,
                               static_cast<float*>(dst), dstride, nchan); break;
    }
}